

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O2

QString * __thiscall QString::assign_helper(QString *this,char32_t *data,qsizetype len)

{
  Data *pDVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  QChar *pQVar4;
  DataEndianness in_R9D;
  QUtf32 *this_00;
  long in_FS_OFFSET;
  QByteArrayView in;
  Data *local_58;
  char16_t *pcStack_50;
  qsizetype local_48;
  anon_union_16_2_cfafc8b3_for_State_4 aStack_40;
  ClearDataFn p_Stack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar1 = (this->d).d;
  if (((pDVar1 == (Data *)0x0) || ((pDVar1->super_QArrayData).alloc < len * 2)) ||
     ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i != 1)) {
    fromUcs4((QString *)&local_58,data,len);
    pDVar1 = (this->d).d;
    pcVar2 = (this->d).ptr;
    (this->d).d = local_58;
    (this->d).ptr = pcStack_50;
    qVar3 = (this->d).size;
    (this->d).size = local_48;
    local_58 = pDVar1;
    pcStack_50 = pcVar2;
    local_48 = qVar3;
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
  }
  else {
    qVar3 = QArrayDataPointer<char16_t>::freeSpaceAtBegin(&this->d);
    this_00 = (QUtf32 *)(this->d).ptr;
    if (qVar3 != 0) {
      this_00 = this_00 + qVar3 * -2;
      (this->d).ptr = (char16_t *)this_00;
    }
    aStack_40.d[1] = (void *)0x0;
    p_Stack_30 = (ClearDataFn)0x0;
    local_48 = 0;
    aStack_40.d[0] = (void *)0x0;
    local_58 = (Data *)0x0;
    pcStack_50 = (char16_t *)0x0;
    in.m_data = (storage_type *)&local_58;
    in.m_size = (qsizetype)data;
    pQVar4 = QUtf32::convertToUnicode(this_00,(QChar *)(len << 2),in,(State *)0x0,in_R9D);
    (this->d).size = (long)pQVar4 - (long)this_00 >> 1;
    *(undefined2 *)((long)(this->d).ptr + ((long)pQVar4 - (long)this_00)) = 0;
    QStringConverterBase::State::clear((State *)&local_58);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

QString &QString::assign_helper(const char32_t *data, qsizetype len)
{
    // worst case: each char32_t requires a surrogate pair, so
    const auto requiredCapacity = len * 2;
    if (requiredCapacity <= capacity() && isDetached()) {
        const auto offset = d.freeSpaceAtBegin();
        if (offset)
            d.setBegin(d.begin() - offset);
        auto begin = reinterpret_cast<QChar *>(d.begin());
        auto ba = QByteArrayView(reinterpret_cast<const std::byte*>(data), len * sizeof(char32_t));
        QStringConverter::State state;
        const auto end = QUtf32::convertToUnicode(begin, ba, &state, DetectEndianness);
        d.size = end - begin;
        d.data()[d.size] = u'\0';
    } else {
        *this = QString::fromUcs4(data, len);
    }
    return *this;
}